

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O0

long test_data_callback(cubeb_stream *stm,void *user_ptr,void *param_3,void *outputbuffer,
                       long nframes)

{
  bool bVar1;
  void *in_RCX;
  int *in_RSI;
  char *in_RDI;
  __int_type in_R8;
  char *unaff_retaddr;
  AssertionResult *in_stack_00000008;
  AssertHelper *in_stack_00000010;
  AssertionResult gtest_ar_;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 uVar2;
  AssertionResult *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  Type in_stack_ffffffffffffffbc;
  undefined7 in_stack_ffffffffffffffc0;
  AssertionResult local_38;
  __int_type local_28;
  void *local_20;
  
  uVar2 = false;
  if (((in_RDI != (char *)0x0) && (uVar2 = false, in_RSI == &dummy)) &&
     (uVar2 = false, in_RCX != (void *)0x0)) {
    uVar2 = 0 < (long)in_R8;
  }
  local_28 = in_R8;
  local_20 = in_RCX;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_ffffffffffffff90,(bool *)CONCAT17(uVar2,in_stack_ffffffffffffff88),
             (type *)0x10eb07);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_38);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_ffffffffffffffc0));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_00000008,unaff_retaddr,in_RDI,(char *)in_RSI);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc,
               in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
    testing::internal::AssertHelper::operator=(in_stack_00000010,(Message *)in_stack_00000008);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff90);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    testing::Message::~Message((Message *)0x10eb9f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10eba9);
  memset(local_20,0,local_28 << 1);
  std::__atomic_base<unsigned_long>::operator+=
            (&total_frames_written.super___atomic_base<unsigned_long>,local_28);
  if (delay_callback != 0) {
    delay(0);
  }
  return local_28;
}

Assistant:

static long
test_data_callback(cubeb_stream * stm, void * user_ptr,
                   const void * /*inputbuffer*/, void * outputbuffer,
                   long nframes)
{
  EXPECT_TRUE(stm && user_ptr == &dummy && outputbuffer && nframes > 0);
  assert(outputbuffer);
  memset(outputbuffer, 0, nframes * sizeof(short));

  total_frames_written += nframes;
  if (delay_callback) {
    delay(10);
  }
  return nframes;
}